

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O1

uint8_t __thiscall lsim::SimCircuit::read_byte(SimCircuit *this,uint32_t comp_id)

{
  Simulator *this_00;
  pin_t pin;
  Value VVar1;
  SimComponent *this_01;
  uint32_t index;
  byte bVar2;
  
  this_01 = component_by_id(this,comp_id);
  if (this_01 == (SimComponent *)0x0) {
    __assert_fail("comp",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                  ,0x6a,"uint8_t lsim::SimCircuit::read_byte(uint32_t)");
  }
  if (this_01->m_output_start != 8) {
    __assert_fail("comp->num_inputs() == 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                  ,0x6c,"uint8_t lsim::SimCircuit::read_byte(uint32_t)");
  }
  index = 0;
  if (this_01->m_output_start == 0) {
    bVar2 = 0;
  }
  else {
    bVar2 = 0;
    do {
      this_00 = this->m_sim;
      pin = SimComponent::pin_by_index(this_01,index);
      VVar1 = Simulator::read_pin(this_00,pin);
      bVar2 = bVar2 | (byte)(VVar1 << ((byte)index & 0x1f));
      index = index + 1;
    } while (index < this_01->m_output_start);
  }
  return bVar2;
}

Assistant:

uint8_t SimCircuit::read_byte(uint32_t comp_id) {
    auto comp = component_by_id(comp_id);
    assert(comp);

    assert(comp->num_inputs() == 8);
    uint8_t result = 0;

    for (int i = 0; i < comp->num_inputs(); ++i) {
        result |= ((int) m_sim->read_pin(comp->pin_by_index(comp->input_pin_index(i)))) << i;
    }

    return result;
}